

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr term_win_init(term_win *s,wchar_t w,wchar_t h)

{
  size_t len;
  int **ppiVar1;
  wchar_t **ppwVar2;
  int *piVar3;
  wchar_t *pwVar4;
  long lVar5;
  ulong uVar6;
  size_t len_00;
  
  len = (long)h * 8;
  ppiVar1 = (int **)mem_zalloc(len);
  s->a = ppiVar1;
  ppwVar2 = (wchar_t **)mem_zalloc(len);
  s->c = ppwVar2;
  len_00 = (long)(h * w) << 2;
  piVar3 = (int *)mem_zalloc(len_00);
  s->va = piVar3;
  pwVar4 = (wchar_t *)mem_zalloc(len_00);
  s->vc = pwVar4;
  ppiVar1 = (int **)mem_zalloc(len);
  s->ta = ppiVar1;
  ppwVar2 = (wchar_t **)mem_zalloc(len);
  s->tc = ppwVar2;
  piVar3 = (int *)mem_zalloc(len_00);
  s->vta = piVar3;
  pwVar4 = (wchar_t *)mem_zalloc(len_00);
  s->vtc = pwVar4;
  if (L'\0' < h) {
    pwVar4 = (wchar_t *)((long)w * 4);
    lVar5 = 0;
    uVar6 = 0;
    do {
      s->a[uVar6] = (int *)((long)s->va + lVar5);
      s->c[uVar6] = (wchar_t *)((long)s->vc + lVar5);
      s->ta[uVar6] = (int *)((long)s->vta + lVar5);
      s->tc[uVar6] = (wchar_t *)((long)s->vtc + lVar5);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + (long)pwVar4;
    } while ((uint)h != uVar6);
  }
  return (errr)pwVar4;
}

Assistant:

static errr term_win_init(term_win *s, int w, int h)
{
	int y;

	/* Make the window access arrays */
	s->a = mem_zalloc_alt(h * sizeof(int*));
	s->c = mem_zalloc_alt(h * sizeof(wchar_t*));

	/* Make the window content arrays */
	s->va = mem_zalloc_alt(h * w * sizeof(int));
	s->vc = mem_zalloc_alt(h * w * sizeof(wchar_t));

	/* Make the terrain access arrays */
	s->ta = mem_zalloc_alt(h * sizeof(int*));
	s->tc = mem_zalloc_alt(h * sizeof(wchar_t*));

	/* Make the terrain content arrays */
	s->vta = mem_zalloc_alt(h * w * sizeof(int));
	s->vtc = mem_zalloc_alt(h * w * sizeof(wchar_t));

	/* Prepare the window access arrays */
	for (y = 0; y < h; y++) {
		s->a[y] = s->va + w * y;
		s->c[y] = s->vc + w * y;

		s->ta[y] = s->vta + w * y;
		s->tc[y] = s->vtc + w * y;
	}

	/* Success */
	return (0);
}